

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::full_formatter::full_formatter(full_formatter *this,padding_info padinfo)

{
  undefined8 uVar1;
  
  uVar1 = padinfo._8_8_;
  (this->super_flag_formatter).padinfo_.width_ = padinfo.width_;
  (this->super_flag_formatter).padinfo_.side_ = (int)uVar1;
  (this->super_flag_formatter).padinfo_.truncate_ = (bool)(char)((ulong)uVar1 >> 0x20);
  (this->super_flag_formatter).padinfo_.enabled_ = (bool)(char)((ulong)uVar1 >> 0x28);
  *(short *)&(this->super_flag_formatter).padinfo_.field_0xe = (short)((ulong)uVar1 >> 0x30);
  (this->super_flag_formatter)._vptr_flag_formatter = (_func_int **)&PTR__full_formatter_004d8d90;
  (this->cache_timestamp_).__r = 0;
  (this->cached_datetime_).super_buffer<char>.size_ = 0;
  (this->cached_datetime_).super_buffer<char>.grow_ =
       ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::grow;
  (this->cached_datetime_).super_buffer<char>.ptr_ = (this->cached_datetime_).store_;
  (this->cached_datetime_).super_buffer<char>.capacity_ = 0xfa;
  (this->mdc_formatter_).super_flag_formatter.padinfo_.width_ = 0;
  (this->mdc_formatter_).super_flag_formatter.padinfo_.side_ = left;
  (this->mdc_formatter_).super_flag_formatter.padinfo_.truncate_ = false;
  (this->mdc_formatter_).super_flag_formatter.padinfo_.enabled_ = false;
  *(undefined2 *)&(this->mdc_formatter_).super_flag_formatter.padinfo_.field_0xe = 0;
  (this->mdc_formatter_).super_flag_formatter._vptr_flag_formatter =
       (_func_int **)&PTR__flag_formatter_004d8de0;
  return;
}

Assistant:

virtual ~flag_formatter() = default;